

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void RenderArrowsForVerticalBar(ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w)

{
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 pos_03;
  ImVec2 half_sz_00;
  ImVec2 half_sz_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = half_sz.x;
  fVar1 = pos.y;
  fVar4 = pos.x + fVar2;
  fVar3 = half_sz.y + 1.0;
  pos_00.y = fVar1;
  pos_00.x = fVar4 + 1.0;
  half_sz_00.y = fVar3;
  half_sz_00.x = fVar2 + 2.0;
  RenderArrow(draw_list,pos_00,half_sz_00,1,0xff000000);
  pos_01.y = fVar1;
  pos_01.x = fVar4;
  RenderArrow(draw_list,pos_01,half_sz,1,0xffffffff);
  fVar4 = (bar_w + pos.x) - fVar2;
  half_sz_01.y = fVar3;
  half_sz_01.x = fVar2 + 2.0;
  pos_02.y = fVar1;
  pos_02.x = fVar4 + -1.0;
  RenderArrow(draw_list,pos_02,half_sz_01,0,0xff000000);
  pos_03.y = fVar1;
  pos_03.x = fVar4;
  RenderArrow(draw_list,pos_03,half_sz,0,0xffffffff);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w)
{
    RenderArrow(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32_BLACK);
    RenderArrow(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32_WHITE);
    RenderArrow(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32_BLACK);
    RenderArrow(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32_WHITE);
}